

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLog.cpp
# Opt level: O2

void __thiscall FIX::FileLog::backup(FileLog *this)

{
  char *pcVar1;
  string *psVar2;
  ostream *poVar3;
  FILE *file;
  FILE *file_00;
  int iVar4;
  char *local_378 [4];
  ofstream *local_358;
  ofstream *local_350;
  string *local_348;
  stringstream eventFileName;
  ostream local_330 [376];
  stringstream messagesFileName;
  ostream local_1a8 [376];
  
  local_350 = &this->m_messages;
  std::ofstream::close();
  local_358 = &this->m_event;
  std::ofstream::close();
  local_348 = (string *)&this->m_fullBackupPrefix;
  iVar4 = 1;
  do {
    psVar2 = local_348;
    std::__cxx11::stringstream::stringstream((stringstream *)&messagesFileName);
    std::__cxx11::stringstream::stringstream((stringstream *)&eventFileName);
    poVar3 = std::operator<<(local_1a8,psVar2);
    poVar3 = std::operator<<(poVar3,"messages.backup.");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar4);
    std::operator<<(poVar3,".log");
    poVar3 = std::operator<<(local_330,psVar2);
    poVar3 = std::operator<<(poVar3,"event.backup.");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar4);
    std::operator<<(poVar3,".log");
    std::__cxx11::stringbuf::str();
    file = file_fopen(local_378[0],"r");
    std::__cxx11::string::~string((string *)local_378);
    std::__cxx11::stringbuf::str();
    file_00 = file_fopen(local_378[0],"r");
    std::__cxx11::string::~string((string *)local_378);
    if (file == (FILE *)0x0 && file_00 == (FILE *)0x0) {
      pcVar1 = (this->m_messagesFileName)._M_dataplus._M_p;
      std::__cxx11::stringbuf::str();
      file_rename(pcVar1,local_378[0]);
      std::__cxx11::string::~string((string *)local_378);
      pcVar1 = (this->m_eventFileName)._M_dataplus._M_p;
      std::__cxx11::stringbuf::str();
      file_rename(pcVar1,local_378[0]);
      std::__cxx11::string::~string((string *)local_378);
      std::ofstream::open((char *)local_350,
                          (_Ios_Openmode)(this->m_messagesFileName)._M_dataplus._M_p);
      std::ofstream::open((char *)local_358,(_Ios_Openmode)(this->m_eventFileName)._M_dataplus._M_p)
      ;
    }
    else {
      if (file != (FILE *)0x0) {
        file_fclose(file);
      }
      if (file_00 != (FILE *)0x0) {
        file_fclose(file_00);
      }
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&eventFileName);
    std::__cxx11::stringstream::~stringstream((stringstream *)&messagesFileName);
    iVar4 = iVar4 + 1;
  } while (file != (FILE *)0x0 || file_00 != (FILE *)0x0);
  return;
}

Assistant:

void FileLog::backup()
{
  m_messages.close();
  m_event.close();

  int i = 0;
  while( true )
  {
    std::stringstream messagesFileName;
    std::stringstream eventFileName;

    messagesFileName << m_fullBackupPrefix << "messages.backup." << ++i << ".log";
    eventFileName << m_fullBackupPrefix << "event.backup." << i << ".log";
    FILE* messagesLogFile = file_fopen( messagesFileName.str().c_str(), "r" );
    FILE* eventLogFile = file_fopen( eventFileName.str().c_str(), "r" );

    if( messagesLogFile == NULL && eventLogFile == NULL )
    {
      file_rename( m_messagesFileName.c_str(), messagesFileName.str().c_str() );
      file_rename( m_eventFileName.c_str(), eventFileName.str().c_str() );
      m_messages.open( m_messagesFileName.c_str(), std::ios::out | std::ios::trunc );
      m_event.open( m_eventFileName.c_str(), std::ios::out | std::ios::trunc );
      return;
    }

    if( messagesLogFile != NULL ) file_fclose( messagesLogFile );
    if( eventLogFile != NULL ) file_fclose( eventLogFile );
  }
}